

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# robin_hood.h
# Opt level: O0

void __thiscall
robin_hood::detail::
Table<true,_80UL,_char,_double,_robin_hood::hash<char,_void>,_std::equal_to<char>_>::clear
          (Table<true,_80UL,_char,_double,_robin_hood::hash<char,_void>,_std::equal_to<char>_> *this
          )

{
  bool bVar1;
  size_t numElements;
  Table<true,_80UL,_char,_double,_robin_hood::hash<char,_void>,_std::equal_to<char>_> *in_RDI;
  uint8_t z;
  size_t numElementsWithBuffer;
  uint8_t *__last;
  uint8_t *__first;
  size_t in_stack_ffffffffffffffe8;
  Table<true,_80UL,_char,_double,_robin_hood::hash<char,_void>,_std::equal_to<char>_>
  *in_stack_fffffffffffffff0;
  
  bVar1 = empty(in_RDI);
  if (!bVar1) {
    Destroyer<robin_hood::detail::Table<true,_80UL,_char,_double,_robin_hood::hash<char,_void>,_std::equal_to<char>_>,_true>
    ::nodes((Destroyer<robin_hood::detail::Table<true,_80UL,_char,_double,_robin_hood::hash<char,_void>,_std::equal_to<char>_>,_true>
             *)&stack0xfffffffffffffff7,in_RDI);
    numElements = calcNumElementsWithBuffer(in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8);
    __first = in_RDI->mInfo;
    __last = in_RDI->mInfo;
    calcNumBytesInfo(in_RDI,numElements);
    std::fill<unsigned_char*,unsigned_char>(__first,__last,(uchar *)0x15d614);
    in_RDI->mInfo[numElements] = '\x01';
    in_RDI->mInfoInc = 0x20;
    in_RDI->mInfoHashShift = 0;
  }
  return;
}

Assistant:

void clear() {
        ROBIN_HOOD_TRACE(this)
        if (empty()) {
            // don't do anything! also important because we don't want to write to
            // DummyInfoByte::b, even though we would just write 0 to it.
            return;
        }

        Destroyer<Self, IsFlat && std::is_trivially_destructible<Node>::value>{}.nodes(*this);

        auto const numElementsWithBuffer = calcNumElementsWithBuffer(mMask + 1);
        // clear everything, then set the sentinel again
        uint8_t const z = 0;
        std::fill(mInfo, mInfo + calcNumBytesInfo(numElementsWithBuffer), z);
        mInfo[numElementsWithBuffer] = 1;

        mInfoInc = InitialInfoInc;
        mInfoHashShift = InitialInfoHashShift;
    }